

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

MainBuilder * __thiscall
kj::MainBuilder::addSubCommand
          (MainBuilder *this,StringPtr name,
          Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
          *getSubParser,StringPtr helpText)

{
  Impl *pIVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_bool>
  pVar2;
  Fault f;
  Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface>
  local_78;
  char *local_68;
  size_t local_60;
  StringPtr local_58;
  pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> local_48;
  
  local_60 = helpText.content.size_;
  local_68 = helpText.content.ptr;
  local_58.content.size_ = name.content.size_;
  local_58.content.ptr = name.content.ptr;
  pIVar1 = (this->impl).ptr;
  if ((pIVar1->args).builder.pos != (pIVar1->args).builder.ptr) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x16c,FAILED,"impl->args.size() == 0",
               "\"cannot have sub-commands when expecting arguments\"",
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    _::Debug::Fault::fatal((Fault *)&local_48);
  }
  if ((pIVar1->finalCallback).ptr.isSet != true) {
    local_78.disposer = (getSubParser->impl).disposer;
    local_48.second.func.impl.ptr = (getSubParser->impl).ptr;
    (getSubParser->impl).ptr = (Iface *)0x0;
    local_78.ptr = (Iface *)0x0;
    local_48.first.content.ptr = local_58.content.ptr;
    local_48.first.content.size_ = local_58.content.size_;
    local_48.second.func.impl.disposer = local_78.disposer;
    local_48.second.helpText.content.ptr = local_68;
    local_48.second.helpText.content.size_ = local_60;
    pVar2 = std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>,std::_Select1st<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
            ::_M_emplace_unique<std::pair<kj::StringPtr,kj::MainBuilder::Impl::SubCommand>>
                      ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>,std::_Select1st<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
                        *)&pIVar1->subCommands,&local_48);
    Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface>
    ::dispose((Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface>
               *)&local_48.second);
    Own<kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Iface>
    ::dispose(&local_78);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return this;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22],kj::StringPtr&>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x172,FAILED,
               "impl->subCommands.insert(std::make_pair( name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second"
               ,"\"duplicate sub-command\", name",(char (*) [22])"duplicate sub-command",&local_58);
    _::Debug::Fault::fatal((Fault *)&local_48);
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
            ((Fault *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
             ,0x16e,FAILED,"impl->finalCallback == nullptr",
             "\"cannot have a final callback when accepting sub-commands\"",
             (char (*) [57])"cannot have a final callback when accepting sub-commands");
  _::Debug::Fault::fatal((Fault *)&local_48);
}

Assistant:

MainBuilder& MainBuilder::addSubCommand(StringPtr name, Function<MainFunc()> getSubParser,
                                        StringPtr helpText) {
  KJ_REQUIRE(impl->args.size() == 0, "cannot have sub-commands when expecting arguments");
  KJ_REQUIRE(impl->finalCallback == nullptr,
             "cannot have a final callback when accepting sub-commands");
  KJ_REQUIRE(
      impl->subCommands.insert(std::make_pair(
          name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second,
      "duplicate sub-command", name);
  return *this;
}